

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

prf_node_t * prf_header_clone_f(prf_node_t *orig,prf_model_t *source,prf_model_t *target)

{
  uint8_t *puVar1;
  long in_RDX;
  uint16_t *in_RDI;
  prf_node_t *clone;
  prf_node_t *local_28;
  undefined8 in_stack_fffffffffffffff8;
  
  if (*(short *)(in_RDX + 8) == 0) {
    local_28 = prf_node_create();
  }
  else {
    local_28 = (prf_node_t *)
               pool_malloc((pool_t)((ulong)in_stack_fffffffffffffff8 >> 0x30),
                           (int)in_stack_fffffffffffffff8);
    prf_node_clear(local_28);
  }
  if (local_28 == (prf_node_t *)0x0) {
    prf_error(9,"memory allocation failure (returned NULL)");
    local_28 = (prf_node_t *)0x0;
  }
  else {
    if (*(short *)(in_RDX + 8) == 0) {
      local_28->flags = local_28->flags | 0x100;
    }
    local_28->opcode = *in_RDI;
    local_28->length = in_RDI[1];
    if (*(short *)(in_RDX + 8) == 0) {
      puVar1 = (uint8_t *)malloc((long)(int)(in_RDI[1] - 4) + 6);
      local_28->data = puVar1;
    }
    else {
      puVar1 = (uint8_t *)
               pool_malloc((pool_t)((ulong)in_stack_fffffffffffffff8 >> 0x30),
                           (int)in_stack_fffffffffffffff8);
      local_28->data = puVar1;
    }
    if (local_28->data == (uint8_t *)0x0) {
      prf_error(9,"memory allocation failure (returned NULL)");
      prf_node_destroy((prf_node_t *)0x10b96d);
      local_28 = (prf_node_t *)0x0;
    }
    else {
      memcpy(local_28->data,*(void **)(in_RDI + 4),(long)(int)(in_RDI[1] - 4) + 6);
    }
  }
  return local_28;
}

Assistant:

static
prf_node_t *
prf_header_clone_f(
    prf_node_t * orig,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_node_t * clone;

    assert( orig != NULL && source != NULL && target != NULL );

    if ( target->mempool_id == 0 ) {
        clone = prf_node_create();
    } else {
        clone = (prf_node_t *)pool_malloc( target->mempool_id, 
					   sizeof( prf_node_t ) );
        prf_node_clear( clone );
    }
    if ( clone == NULL ) {
        prf_error( 9, "memory allocation failure (returned NULL)" );
        return NULL;
    }
    if ( target->mempool_id == 0 )
        clone->flags |= PRF_NODE_MEMPOOLED;

    clone->opcode = orig->opcode;
    clone->length = orig->length;
    assert( orig->data != NULL && orig->length > 4 );

    if ( target->mempool_id == 0 )
        clone->data = (uint8_t *)malloc( orig->length - 4 + NODE_DATA_PAD );
    else
        clone->data = (uint8_t *)pool_malloc( target->mempool_id,
            orig->length - 4 + NODE_DATA_PAD );
    if ( clone->data == NULL ) {
        prf_error( 9, "memory allocation failure (returned NULL)" );
        prf_node_destroy( clone );
        return NULL;
    }
    memcpy( clone->data, orig->data, orig->length - 4 + NODE_DATA_PAD );
 /* clone->flags */
    return clone;
}